

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::collapseAccessChain(Builder *this)

{
  Id *__args;
  uint uVar1;
  iterator __position;
  Instruction *pIVar2;
  StorageClass storageClass;
  Id IVar3;
  
  if ((this->accessChain).isRValue == false) {
    IVar3 = (this->accessChain).instr;
    if (IVar3 == 0) {
      remapDynamicSwizzle(this);
      uVar1 = (this->accessChain).component;
      if (uVar1 != 0) {
        __args = &(this->accessChain).component;
        __position._M_current =
             (this->accessChain).indexChain.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->accessChain).indexChain.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &(this->accessChain).indexChain,__position,__args);
        }
        else {
          *__position._M_current = uVar1;
          (this->accessChain).indexChain.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        *__args = 0;
      }
      if ((this->accessChain).indexChain.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->accessChain).indexChain.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        IVar3 = (this->accessChain).base;
      }
      else {
        pIVar2 = (this->module).idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[(this->accessChain).base];
        if (pIVar2 == (Instruction *)0x0) {
          IVar3 = 0;
        }
        else {
          IVar3 = pIVar2->typeId;
        }
        storageClass = Module::getStorageClass(&this->module,IVar3);
        IVar3 = createAccessChain(this,storageClass,(this->accessChain).base,
                                  &(this->accessChain).indexChain);
        (this->accessChain).instr = IVar3;
      }
    }
    return IVar3;
  }
  __assert_fail("accessChain.isRValue == false",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x1093,"Id spv::Builder::collapseAccessChain()");
}

Assistant:

Id Builder::collapseAccessChain()
{
    assert(accessChain.isRValue == false);

    // did we already emit an access chain for this?
    if (accessChain.instr != NoResult)
        return accessChain.instr;

    // If we have a dynamic component, we can still transfer
    // that into a final operand to the access chain.  We need to remap the
    // dynamic component through the swizzle to get a new dynamic component to
    // update.
    //
    // This was not done in transferAccessChainSwizzle() because it might
    // generate code.
    remapDynamicSwizzle();
    if (accessChain.component != NoResult) {
        // transfer the dynamic component to the access chain
        accessChain.indexChain.push_back(accessChain.component);
        accessChain.component = NoResult;
    }

    // note that non-trivial swizzling is left pending

    // do we have an access chain?
    if (accessChain.indexChain.size() == 0)
        return accessChain.base;

    // emit the access chain
    StorageClass storageClass = (StorageClass)module.getStorageClass(getTypeId(accessChain.base));
    accessChain.instr = createAccessChain(storageClass, accessChain.base, accessChain.indexChain);

    return accessChain.instr;
}